

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *this_00;
  char *pcVar2;
  cmGeneratorTarget *this_01;
  bool bVar3;
  TargetType TVar4;
  char *__s;
  char *pcVar5;
  string static_link_type_flag_var;
  string shared_link_type_flag_var;
  string local_70;
  string local_50;
  
  this_00 = this->CMakeInstance->State;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS","");
  bVar3 = cmState::GetGlobalPropertyAsBool(this_00,&local_70);
  this->ArchivesMayBeShared = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this->LinkTypeEnabled = false;
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if (((TVar4 == EXECUTABLE) || (TVar4 == SHARED_LIBRARY)) || (TVar4 == MODULE_LIBRARY)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  if (bVar3) {
    pcVar5 = (char *)0x0;
    __s = (char *)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_","");
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_70);
    pcVar5 = cmMakefile::GetDefinition(this->Makefile,&local_70);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_","");
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_50);
    __s = cmMakefile::GetDefinition(this->Makefile,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (((pcVar5 != (char *)0x0) && (__s != (char *)0x0)) && ((*pcVar5 != '\0' && (*__s != '\0')))) {
    this->LinkTypeEnabled = true;
    pcVar2 = (char *)(this->StaticLinkTypeFlag)._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&this->StaticLinkTypeFlag,0,pcVar2,(ulong)pcVar5);
    pcVar5 = (char *)(this->SharedLinkTypeFlag)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->SharedLinkTypeFlag,0,pcVar5,(ulong)__s);
  }
  this_01 = this->Target;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"LINK_SEARCH_START_STATIC","")
  ;
  pcVar5 = cmGeneratorTarget::GetProperty(this_01,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmSystemTools::IsOn(pcVar5);
  this->StartLinkType = LinkShared - bVar3;
  this->CurrentLinkType = LinkShared - bVar3;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  const char* static_link_type_flag = CM_NULLPTR;
  const char* shared_link_type_flag = CM_NULLPTR;
  const char* target_type_str = CM_NULLPTR;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var = "CMAKE_";
    static_link_type_flag_var += target_type_str;
    static_link_type_flag_var += "_LINK_STATIC_";
    static_link_type_flag_var += this->LinkLanguage;
    static_link_type_flag_var += "_FLAGS";
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var = "CMAKE_";
    shared_link_type_flag_var += target_type_str;
    shared_link_type_flag_var += "_LINK_DYNAMIC_";
    shared_link_type_flag_var += this->LinkLanguage;
    shared_link_type_flag_var += "_FLAGS";
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (static_link_type_flag && *static_link_type_flag &&
      shared_link_type_flag && *shared_link_type_flag) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = static_link_type_flag;
    this->SharedLinkTypeFlag = shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  const char* lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmSystemTools::IsOn(lss) ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}